

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O1

void __thiscall jsonnet::internal::LiteralNumber::~LiteralNumber(LiteralNumber *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_AST)._vptr_AST = (_func_int **)&PTR__LiteralNumber_0023de60;
  pcVar2 = (this->originalString)._M_dataplus._M_p;
  paVar1 = &(this->originalString).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  AST::~AST(&this->super_AST);
  operator_delete(this,0xa8);
  return;
}

Assistant:

LiteralNumber(const LocationRange &lr, const Fodder &open_fodder, const std::string &str)
        : AST(lr, AST_LITERAL_NUMBER, open_fodder),
          value(strtod(str.c_str(), nullptr)),
          originalString(str)
    {
    }